

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiceDriver.cpp
# Opt level: O0

bool test_DiceRoller_getDiceRolled(void)

{
  int iVar1;
  DiceRoller *pDVar2;
  bool bVar3;
  undefined1 local_40 [7];
  bool success;
  int local_24;
  int local_20;
  int x;
  int rolls;
  DiceRoller *local_10;
  DiceRoller *roller;
  
  pDVar2 = (DiceRoller *)operator_new(0x10);
  DiceRoller::DiceRoller(pDVar2);
  local_20 = 0;
  local_10 = pDVar2;
  for (local_24 = 0; local_24 < 10; local_24 = local_24 + 1) {
    local_20 = local_24 + local_20;
    DiceRoller::roll((vector<int,_std::allocator<int>_> *)local_40,local_10,local_24);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_40);
  }
  iVar1 = DiceRoller::getDiceRolled(local_10);
  pDVar2 = local_10;
  bVar3 = iVar1 == local_20;
  if (local_10 != (DiceRoller *)0x0) {
    DiceRoller::~DiceRoller(local_10);
    operator_delete(pDVar2,0x10);
  }
  return bVar3;
}

Assistant:

bool test_DiceRoller_getDiceRolled() {
    auto* roller = new DiceRoller();

    int rolls = 0;
    for (int x = 0; x < 10; x++) {
        rolls += x;
        roller->roll(x);
    }

    bool success = roller->getDiceRolled() == rolls;
    delete (roller);

    return success;
}